

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O2

void __thiscall
implementations::brainfck::BFImplementation::~BFImplementation(BFImplementation *this)

{
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00130980;
  stackless::
  Frame<char,_implementations::brainfck::BFOperations,_implementations::brainfck::BFEnvironment>::
  ~Frame(&(this->frame).super_BFStacklessFrame);
  stackless::
  Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>::
  ~Implementation(&this->
                   super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
                 );
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}